

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall Rml::ElementDocument::Hide(ElementDocument *this)

{
  undefined1 local_68 [16];
  pointer local_58;
  
  Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>((Property *)local_68,Hidden);
  Element::SetProperty(&this->super_Element,Visibility,(Property *)local_68);
  Property::~Property((Property *)local_68);
  UpdateDocument(this);
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_58 = (pointer)0x0;
  Element::DispatchEvent(&this->super_Element,Hide,(Dictionary *)local_68);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)local_68);
  if (this->context != (Context *)0x0) {
    Context::UnfocusDocument(this->context,this);
  }
  return;
}

Assistant:

void ElementDocument::Hide()
{
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));

	// We should update the document now, so that the (un)focusing will get the correct visibility
	UpdateDocument();

	DispatchEvent(EventId::Hide, Dictionary());

	if (context)
	{
		context->UnfocusDocument(this);
	}
}